

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::LineInterpolationTest::LineInterpolationTest
          (LineInterpolationTest *this,Context *ctx,char *name,char *desc,GLenum primitive,int flags
          ,float lineWidth)

{
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,desc);
  (this->super_BaseRenderingCase).super_TestCase.m_context = ctx;
  (this->super_BaseRenderingCase).m_renderSize = 0x100;
  (this->super_BaseRenderingCase).m_numSamples = -1;
  (this->super_BaseRenderingCase).m_subpixelBits = -1;
  *(undefined1 **)&(this->super_BaseRenderingCase).m_pointSize = &DAT_3f8000003f800000;
  (this->super_BaseRenderingCase).m_shader = (ShaderProgram *)0x0;
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LineInterpolationTest_02168b18;
  this->m_primitive = primitive;
  this->m_projective = (bool)((byte)flags >> 1 & 1);
  this->m_iterationCount = 3;
  this->m_iteration = 0;
  tcu::ResultCollector::ResultCollector(&this->m_result);
  (this->super_BaseRenderingCase).m_lineWidth = lineWidth;
  return;
}

Assistant:

LineInterpolationTest::LineInterpolationTest (Context& ctx, const char* name, const char* desc, glw::GLenum primitive, int flags, float lineWidth)
	: BaseRenderingCase		(ctx, name, desc)
	, m_primitive			(primitive)
	, m_projective			((flags & INTERPOLATIONFLAGS_PROJECTED) != 0)
	, m_iterationCount		(3)
	, m_iteration			(0)
{
	m_lineWidth = lineWidth;
}